

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

CharFormat testing::internal::PrintCharsAsStringTo<wchar_t>(wchar_t *begin,size_t len,ostream *os)

{
  wchar_t c;
  int iVar1;
  CharFormat CVar2;
  ostream *poVar3;
  uchar low_byte;
  size_t sVar4;
  bool bVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"L\"",2);
  if (len != 0) {
    bVar5 = false;
    sVar4 = 0;
    do {
      c = begin[sVar4];
      if ((bool)((uint)c < 0x100 & bVar5)) {
        iVar1 = isxdigit(c);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(os,"L\"",2);
        }
      }
      CVar2 = PrintAsStringLiteralTo(c,os);
      bVar5 = CVar2 == kHexEscape;
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return (CharFormat)poVar3;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}